

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserDPOMDPFormat_Spirit.cpp
# Opt level: O1

void __thiscall
DPOMDPFormatParsing::ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations
          (StoreLPJointObservation *this,Index curAgent,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *indIndices)

{
  ParserDPOMDPFormat_Spirit *pPVar1;
  pointer puVar2;
  iterator __position;
  ulong uVar3;
  ostream *poVar4;
  undefined8 *puVar5;
  ulong uVar6;
  ulong uVar7;
  Index joI;
  E e;
  stringstream msg;
  uint local_23c;
  StoreLPJointObservation *local_238;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_210;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_1f8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  pPVar1 = this->_m_po;
  puVar2 = (indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (pPVar1->_m_nrA !=
      (long)(indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar2 >> 2) {
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,"individual obs indices vector has wrong size. (",0x2f);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," while nrAgents is ",0x13);
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"at(",3);
    poVar4 = DPOMDPFormatParsing::operator<<(poVar4,&this->_m_po->_m_first->_pos);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    std::endl<char,std::char_traits<char>>(poVar4);
    puVar5 = (undefined8 *)__cxa_allocate_exception(0x28);
    *puVar5 = &PTR__E_0059bd80;
    std::__cxx11::stringbuf::str();
    *puVar5 = &PTR__E_005ce150;
    __cxa_throw(puVar5,&EParse::typeinfo,E::~E);
  }
  uVar7 = (ulong)curAgent;
  if (pPVar1->_m_nrA == uVar7) {
    local_23c = 0;
    local_23c = (**(code **)(*(long *)&(pPVar1->_m_decPOMDPDiscrete->
                                       super_MultiAgentDecisionProcessDiscrete).
                                       super_MultiAgentDecisionProcess + 0xe8))
                          (pPVar1->_m_decPOMDPDiscrete,indIndices);
    pPVar1 = this->_m_po;
    __position._M_current =
         (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         .super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&pPVar1->_m_lp_JOI,__position,
                 &local_23c);
    }
    else {
      *__position._M_current = local_23c;
      (pPVar1->_m_lp_JOI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
  }
  else if (puVar2[uVar7] == pPVar1->_m_anyJOIndex) {
    local_238 = this;
    uVar3 = (**(code **)(*(long *)&(pPVar1->_m_decPOMDPDiscrete->
                                   super_MultiAgentDecisionProcessDiscrete).
                                   super_MultiAgentDecisionProcess + 200))
                      (pPVar1->_m_decPOMDPDiscrete,curAgent);
    if (uVar3 != 0) {
      uVar6 = 0;
      do {
        (indIndices->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar7] = (uint)uVar6;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(local_1f8,indIndices);
        MatchingJointObservations(local_238,curAgent + 1,local_1f8);
        if (local_1f8[0].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_1f8[0].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8[0].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8[0].
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        uVar6 = (ulong)((uint)uVar6 + 1);
      } while (uVar6 < uVar3);
    }
  }
  else {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_210,indIndices);
    MatchingJointObservations(this,curAgent + 1,&local_210);
    if (local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_210.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_210.
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void ParserDPOMDPFormat_Spirit::StoreLPJointObservation::MatchingJointObservations (Index curAgent, vector<Index> indIndices) const
{
    if(_m_po->_m_nrA != indIndices.size())
    {
        stringstream msg;
        msg << "individual obs indices vector has wrong size. ("<<indIndices.size() << 
            " while nrAgents is " <<_m_po->_m_nrA << ")" << "at(" << 
            _m_po->_m_first->get_position() << ")" << endl;;
        throw EParse(msg);
    }
    if(curAgent == _m_po->_m_nrA) //past last agent: all work done
    {
        Index joI = 0;
        try
        {
            joI = _m_po->GetDecPOMDPDiscrete()->IndividualToJointObservationIndices(
                    indIndices);
            _m_po->_m_lp_JOI.push_back(joI);
        }
        catch(E e)
        {
            stringstream ss; ss <<e.SoftPrint() << "at(" << _m_po->_m_first->get_position() <<
                ")" << endl;
            throw EParse(ss);
        }
        if(DEBUG_PARSE)
        {
            cout<<"MatchingJointObservations: joint observation index for < ";
            vector<Index>::iterator it = indIndices.begin();
            vector<Index>::iterator last = indIndices.end();
            while(it != last){ cout << *it <<" "; it++;}
            cout <<   "> = "<<joI<<endl;
        }
    }
    else //not past last agent: work to be done
    {
        if(indIndices[curAgent] == _m_po->_m_anyJOIndex)
        {
            //do for each action of this agent
            size_t nrObs = _m_po->GetDecPOMDPDiscrete()->GetNrObservations(curAgent);
            for(Index oi=0; oi < nrObs; oi++)
            {
                indIndices[curAgent] = oi;
                MatchingJointObservations(curAgent+1, indIndices);
            }
        }
        else
            MatchingJointObservations(curAgent+1, indIndices);
    }
}